

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O1

int32_t mtmd_encode(mtmd_context *ctx,mtmd_image_tokens *image_tokens)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer puVar4;
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  *entries;
  long lVar5;
  ulong uVar6;
  clip_image_size local_38;
  
  iVar2 = clip_n_mmproj_embd(ctx->ctx_clip);
  std::vector<float,_std::allocator<float>_>::resize
            (&ctx->image_embd_v,(ulong)(image_tokens->nx * iVar2 * image_tokens->ny));
  local_38 = *(clip_image_size *)
              (((image_tokens->batch_f32).entries.
                super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
              super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>;
  clip_add_load_image_size(ctx->ctx_clip,&local_38);
  bVar1 = clip_is_llava(ctx->ctx_clip);
  if (((bVar1) || (iVar3 = clip_is_minicpmv(ctx->ctx_clip), iVar3 != 0)) ||
     (bVar1 = clip_is_glm(ctx->ctx_clip), bVar1)) {
    puVar4 = (image_tokens->batch_f32).entries.
             super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((image_tokens->batch_f32).entries.
        super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == puVar4) {
      bVar1 = false;
    }
    else {
      lVar5 = 0;
      uVar6 = 0;
      do {
        iVar3 = clip_n_patches_by_img
                          (ctx->ctx_clip,
                           puVar4[uVar6]._M_t.
                           super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
                           super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
                           super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl);
        bVar1 = clip_image_encode(ctx->ctx_clip,ctx->n_threads,
                                  (clip_image_f32 *)
                                  (image_tokens->batch_f32).entries.
                                  super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                                  super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>,
                                  (ctx->image_embd_v).
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start + iVar3 * lVar5);
        uVar6 = uVar6 + 1;
        puVar4 = (image_tokens->batch_f32).entries.
                 super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + iVar2;
      } while (uVar6 < (ulong)((long)(image_tokens->batch_f32).entries.
                                     super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3)
              );
    }
  }
  else {
    bVar1 = clip_image_batch_encode
                      (ctx->ctx_clip,ctx->n_threads,&image_tokens->batch_f32,
                       (ctx->image_embd_v).super__Vector_base<float,_std::allocator<float>_>._M_impl
                       .super__Vector_impl_data._M_start);
  }
  return (int32_t)(bVar1 ^ 1);
}

Assistant:

int32_t mtmd_encode(mtmd_context * ctx, const mtmd_image_tokens * image_tokens) {
    int n_mmproj_embd = clip_n_mmproj_embd(ctx->ctx_clip);
    ctx->image_embd_v.resize(image_tokens->n_tokens() * n_mmproj_embd);
    bool ok = false;

    // only effective for minicpmv and qwen2vl, other models will ignore load_image_size
    {
        clip_image_size slice_size{
            image_tokens->batch_f32.entries[0]->nx,
            image_tokens->batch_f32.entries[0]->ny};
        clip_add_load_image_size(ctx->ctx_clip, &slice_size);
    }

    if (clip_is_llava(ctx->ctx_clip) || clip_is_minicpmv(ctx->ctx_clip) || clip_is_glm(ctx->ctx_clip)) {
        // TODO @ngxson : llava does not support batched encoding ; this should be fixed inside clip_image_batch_encode()
        const auto & entries = image_tokens->batch_f32.entries;
        for (size_t i = 0; i < entries.size(); i++) {
            int n_tokens_per_image = clip_n_patches_by_img(ctx->ctx_clip, entries[i].get());
            ok = clip_image_encode(
                ctx->ctx_clip,
                ctx->n_threads,
                entries[i].get(),
                ctx->image_embd_v.data() + i*n_mmproj_embd*n_tokens_per_image);
        }
    } else {
        ok = clip_image_batch_encode(
            ctx->ctx_clip,
            ctx->n_threads,
            &image_tokens->batch_f32,
            ctx->image_embd_v.data());
    }

    return ok ? 0 : 1;
}